

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  binary_op_t bVar1;
  bool bVar2;
  lexeme_t lVar3;
  xpath_lexer_string *this;
  xpath_lexer *in_RDI;
  char_t *in_stack_ffffffffffffffc8;
  binary_op_t local_c;
  
  lVar3 = xpath_lexer::current(in_RDI);
  this = (xpath_lexer_string *)(ulong)(lVar3 - lex_equal);
  switch(this) {
  case (xpath_lexer_string *)0x0:
    binary_op_t(&local_c,ast_op_equal,xpath_type_boolean,3);
    break;
  case (xpath_lexer_string *)0x1:
    binary_op_t(&local_c,ast_op_not_equal,xpath_type_boolean,3);
    break;
  case (xpath_lexer_string *)0x2:
    binary_op_t(&local_c,ast_op_less,xpath_type_boolean,4);
    break;
  case (xpath_lexer_string *)0x3:
    binary_op_t(&local_c,ast_op_greater,xpath_type_boolean,4);
    break;
  case (xpath_lexer_string *)0x4:
    binary_op_t(&local_c,ast_op_less_or_equal,xpath_type_boolean,4);
    break;
  case (xpath_lexer_string *)0x5:
    binary_op_t(&local_c,ast_op_greater_or_equal,xpath_type_boolean,4);
    break;
  case (xpath_lexer_string *)0x6:
    binary_op_t(&local_c,ast_op_add,xpath_type_number,5);
    break;
  case (xpath_lexer_string *)0x7:
    binary_op_t(&local_c,ast_op_subtract,xpath_type_number,5);
    break;
  case (xpath_lexer_string *)0x8:
    binary_op_t(&local_c,ast_op_multiply,xpath_type_number,6);
    break;
  case (xpath_lexer_string *)0x9:
    binary_op_t(&local_c,ast_op_union,xpath_type_node_set,7);
    break;
  default:
    binary_op_t(&local_c);
    break;
  case (xpath_lexer_string *)0x13:
    xpath_lexer::contents(in_RDI);
    bVar2 = xpath_lexer_string::operator==(this,in_stack_ffffffffffffffc8);
    if (bVar2) {
      binary_op_t(&local_c,ast_op_or,xpath_type_boolean,1);
    }
    else {
      xpath_lexer::contents(in_RDI);
      bVar2 = xpath_lexer_string::operator==(this,in_stack_ffffffffffffffc8);
      if (bVar2) {
        binary_op_t(&local_c,ast_op_and,xpath_type_boolean,2);
      }
      else {
        xpath_lexer::contents(in_RDI);
        bVar2 = xpath_lexer_string::operator==(this,in_stack_ffffffffffffffc8);
        if (bVar2) {
          binary_op_t(&local_c,ast_op_divide,xpath_type_number,6);
        }
        else {
          xpath_lexer::contents(in_RDI);
          bVar2 = xpath_lexer_string::operator==(this,in_stack_ffffffffffffffc8);
          if (bVar2) {
            binary_op_t(&local_c,ast_op_mod,xpath_type_number,6);
          }
          else {
            binary_op_t(&local_c);
          }
        }
      }
    }
  }
  bVar1.precedence = local_c.precedence;
  bVar1.asttype = local_c.asttype;
  bVar1.rettype = local_c.rettype;
  return bVar1;
}

Assistant:

static binary_op_t parse(xpath_lexer& lexer)
			{
				switch (lexer.current())
				{
				case lex_string:
					if (lexer.contents() == PUGIXML_TEXT("or"))
						return binary_op_t(ast_op_or, xpath_type_boolean, 1);
					else if (lexer.contents() == PUGIXML_TEXT("and"))
						return binary_op_t(ast_op_and, xpath_type_boolean, 2);
					else if (lexer.contents() == PUGIXML_TEXT("div"))
						return binary_op_t(ast_op_divide, xpath_type_number, 6);
					else if (lexer.contents() == PUGIXML_TEXT("mod"))
						return binary_op_t(ast_op_mod, xpath_type_number, 6);
					else
						return binary_op_t();

				case lex_equal:
					return binary_op_t(ast_op_equal, xpath_type_boolean, 3);

				case lex_not_equal:
					return binary_op_t(ast_op_not_equal, xpath_type_boolean, 3);

				case lex_less:
					return binary_op_t(ast_op_less, xpath_type_boolean, 4);

				case lex_greater:
					return binary_op_t(ast_op_greater, xpath_type_boolean, 4);

				case lex_less_or_equal:
					return binary_op_t(ast_op_less_or_equal, xpath_type_boolean, 4);

				case lex_greater_or_equal:
					return binary_op_t(ast_op_greater_or_equal, xpath_type_boolean, 4);

				case lex_plus:
					return binary_op_t(ast_op_add, xpath_type_number, 5);

				case lex_minus:
					return binary_op_t(ast_op_subtract, xpath_type_number, 5);

				case lex_multiply:
					return binary_op_t(ast_op_multiply, xpath_type_number, 6);

				case lex_union:
					return binary_op_t(ast_op_union, xpath_type_node_set, 7);

				default:
					return binary_op_t();
				}
			}